

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall
front::symbol::FunctionSymbol::FunctionSymbol
          (FunctionSymbol *this,string *name,SymbolKind ret,int layerNum)

{
  int iVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Symbol::Symbol(&this->super_Symbol,&local_40,layerNum);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001daa98;
  this->_ret = ret;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_params).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

FunctionSymbol(string name, SymbolKind ret, int layerNum = 0)
      : _ret(ret), Symbol(name, layerNum) {
    id = Symbol::symbolId++;
  }